

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

size_t __thiscall GYMPlayer::DeviceID2OptionID(GYMPlayer *this,UINT32 id)

{
  pointer pDVar1;
  ulong uVar2;
  
  if ((int)id < 0) {
    if ((id & 0xff0000) != 0) {
      return 0xffffffffffffffff;
    }
  }
  else {
    pDVar1 = (this->_devCfgs).
             super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_devCfgs).
                      super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 5) <= (ulong)id) {
      return 0xffffffffffffffff;
    }
    id = (UINT32)pDVar1[id].type;
  }
  uVar2 = -(ulong)((char)id != '\0') | 1;
  if ((char)id == '\x02') {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

size_t GYMPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devCfgs.size())
	{
		type = _devCfgs[id].type;
		instance = 0;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (instance == 0)
	{
		if (type == DEVID_YM2612)
			return 0;
		else if (type == DEVID_SN76496)
			return 1;
	}
	return (size_t)-1;
}